

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void arm_max_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  uint32_t uVar1;
  anon_struct_4_1_54a39816 v_18;
  anon_struct_4_1_54a39816 v_17;
  anon_struct_4_1_54a39816 v_16;
  anon_struct_4_1_54a39816 v_15;
  anon_struct_4_1_54a39816 v_14;
  anon_struct_4_1_54a39816 v_13;
  anon_struct_4_1_54a39816 v_12;
  anon_struct_4_1_54a39816 v_11;
  anon_struct_4_1_54a39816 v_10;
  anon_struct_4_1_54a39816 v_9;
  anon_struct_4_1_54a39816 v_8;
  anon_struct_4_1_54a39816 v_7;
  anon_struct_4_1_54a39816 v_6;
  anon_struct_4_1_54a39816 v_5;
  anon_struct_4_1_54a39816 v_4;
  anon_struct_4_1_54a39816 v_3;
  anon_struct_4_1_54a39816 v_2;
  anon_struct_4_1_54a39816 v_1;
  uint32_t t;
  anon_struct_4_1_54a39816 v;
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  cortex_a15_initfn(uc,obj);
  uVar1 = deposit32(*(uint32_t *)(obj[1].tb_jmp_cache + 0x63a),0x18,4,1);
  *(uint32_t *)(obj[1].tb_jmp_cache + 0x63a) = uVar1;
  set_feature((CPUARMState *)(obj[1].tb_jmp_cache + 0x3ff),0x1b);
  uVar1 = deposit32(*(uint32_t *)((long)obj[1].tb_jmp_cache + 0x31b4),4,4,2);
  uVar1 = deposit32(uVar1,8,4,1);
  uVar1 = deposit32(uVar1,0xc,4,1);
  uVar1 = deposit32(uVar1,0x10,4,1);
  uVar1 = deposit32(uVar1,0x18,4,1);
  uVar1 = deposit32(uVar1,0x1c,4,1);
  *(uint32_t *)((long)obj[1].tb_jmp_cache + 0x31b4) = uVar1;
  uVar1 = deposit32(*(uint32_t *)(obj[1].tb_jmp_cache + 0x637),0,4,1);
  uVar1 = deposit32(uVar1,4,4,1);
  uVar1 = deposit32(uVar1,8,4,1);
  uVar1 = deposit32(uVar1,0xc,4,1);
  uVar1 = deposit32(uVar1,0x10,4,1);
  *(uint32_t *)(obj[1].tb_jmp_cache + 0x637) = uVar1;
  uVar1 = deposit32(*(uint32_t *)((long)obj[1].tb_jmp_cache + 0x31d4),0x18,4,2);
  *(uint32_t *)((long)obj[1].tb_jmp_cache + 0x31d4) = uVar1;
  uVar1 = deposit32(*(uint32_t *)(obj[1].tb_jmp_cache + 0x63b),0,4,3);
  uVar1 = deposit32(uVar1,4,4,4);
  *(uint32_t *)(obj[1].tb_jmp_cache + 0x63b) = uVar1;
  uVar1 = deposit32(*(uint32_t *)(obj[1].tb_jmp_cache + 0x639),0x10,4,2);
  *(uint32_t *)(obj[1].tb_jmp_cache + 0x639) = uVar1;
  uVar1 = deposit32(*(uint32_t *)((long)obj[1].tb_jmp_cache + 0x31cc),0x10,4,1);
  uVar1 = deposit32(uVar1,4,4,1);
  uVar1 = deposit32(uVar1,0xc,4,1);
  *(uint32_t *)((long)obj[1].tb_jmp_cache + 0x31cc) = uVar1;
  return;
}

Assistant:

static void arm_max_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    {
        cortex_a15_initfn(uc, obj);

        /* old-style VFP short-vector support */
        FIELD_DP32(cpu->isar.mvfr0, MVFR0, FPSHVEC, 1, cpu->isar.mvfr0);

// Unicorn: Enable this on ARM_MAX
//#ifdef CONFIG_USER_ONLY
        /* We don't set these in system emulation mode for the moment,
         * since we don't correctly set (all of) the ID registers to
         * advertise them.
         */
        set_feature(&cpu->env, ARM_FEATURE_V8);
        {
            uint32_t t;

            t = cpu->isar.id_isar5;
            FIELD_DP32(t, ID_ISAR5, AES, 2, t);
            FIELD_DP32(t, ID_ISAR5, SHA1, 1, t);
            FIELD_DP32(t, ID_ISAR5, SHA2, 1, t);
            FIELD_DP32(t, ID_ISAR5, CRC32, 1, t);
            FIELD_DP32(t, ID_ISAR5, RDM, 1, t);
            FIELD_DP32(t, ID_ISAR5, VCMA, 1, t);
            cpu->isar.id_isar5 = t;

            t = cpu->isar.id_isar6;
            FIELD_DP32(t, ID_ISAR6, JSCVT, 1, t);
            FIELD_DP32(t, ID_ISAR6, DP, 1, t);
            FIELD_DP32(t, ID_ISAR6, FHM, 1, t);
            FIELD_DP32(t, ID_ISAR6, SB, 1, t);
            FIELD_DP32(t, ID_ISAR6, SPECRES, 1, t);
            cpu->isar.id_isar6 = t;

            t = cpu->isar.mvfr1;
            FIELD_DP32(t, MVFR1, FPHP, 2, t);     /* v8.0 FP support */
            cpu->isar.mvfr1 = t;

            t = cpu->isar.mvfr2;
            FIELD_DP32(t, MVFR2, SIMDMISC, 3, t); /* SIMD MaxNum */
            FIELD_DP32(t, MVFR2, FPMISC, 4, t);   /* FP MaxNum */
            cpu->isar.mvfr2 = t;

            t = cpu->isar.id_mmfr3;
            FIELD_DP32(t, ID_MMFR3, PAN, 2, t); /* ATS1E1 */
            cpu->isar.id_mmfr3 = t;

            t = cpu->isar.id_mmfr4;
            FIELD_DP32(t, ID_MMFR4, HPDS, 1, t); /* AA32HPD */
            FIELD_DP32(t, ID_MMFR4, AC2, 1, t); /* ACTLR2, HACTLR2 */
            FIELD_DP32(t, ID_MMFR4, CNP, 1, t); /* TTCNP */
            cpu->isar.id_mmfr4 = t;
        }
//#endif
    }
}